

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O2

int xar_read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  long *plVar2;
  ulong uVar3;
  undefined8 uVar4;
  xar *xar;
  undefined8 *puVar5;
  xattr *pxVar6;
  ushort uVar7;
  uint uVar8;
  wchar_t wVar9;
  uint32_t uVar10;
  int iVar11;
  enctype eVar12;
  archive_string_conv *paVar13;
  void *pvVar14;
  int *piVar15;
  uint64_t uVar16;
  long lVar17;
  xmlattr *__ptr;
  char *pcVar18;
  byte *__s;
  time_t tVar19;
  xattr *pxVar20;
  ulong uVar21;
  size_t sVar22;
  hdlink *phVar23;
  xmlstatus xVar24;
  xar_file *pxVar25;
  xattr *pxVar26;
  int iVar27;
  char *pcVar28;
  size_t sVar29;
  void **_p;
  size_t *psVar30;
  long *plVar31;
  long *plVar32;
  long lVar33;
  archive_string *as;
  ulong uVar34;
  size_t n;
  int iVar35;
  byte *pbVar36;
  undefined8 *puVar37;
  size_t outbytes;
  xmlattr *local_180;
  archive_entry *local_178;
  xar_file *local_170;
  long *local_168;
  uint32_t local_15c;
  size_t used;
  int local_14c;
  hdlink *local_148;
  uint64_t local_140;
  void *d;
  
  plVar2 = (long *)a->format->data;
  if (*plVar2 != 0) goto LAB_0013224d;
  local_168 = plVar2;
  if (plVar2[0x4a] == 0) {
    paVar13 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    plVar2[0x4a] = (long)paVar13;
    if (paVar13 == (archive_string_conv *)0x0) {
      return -0x1e;
    }
    local_168 = (long *)a->format->data;
  }
  pvVar14 = __archive_read_ahead(a,0x1c,(ssize_t *)&used);
  if (-1 < (long)used) {
    if (used < 0x1c) {
      pcVar28 = "Truncated archive header";
    }
    else {
      uVar10 = archive_be32dec(pvVar14);
      if (uVar10 == 0x78617221) {
        uVar7 = *(ushort *)((long)pvVar14 + 6) << 8 | *(ushort *)((long)pvVar14 + 6) >> 8;
        if (uVar7 != 1) {
          archive_set_error(&a->archive,0x54,"Unsupported header version(%d)",(ulong)uVar7);
          return -0x1e;
        }
        uVar16 = archive_be64dec((void *)((long)pvVar14 + 8));
        plVar32 = local_168;
        local_168[8] = uVar16;
        local_140 = archive_be64dec((void *)((long)pvVar14 + 0x10));
        local_15c = archive_be32dec((void *)((long)pvVar14 + 0x18));
        __archive_read_consume(a,0x1c);
        *plVar32 = *plVar32 + 0x1c;
        plVar32[9] = 0;
        iVar11 = move_reading_point(a,0x1c);
        if (iVar11 != 0) {
          return iVar11;
        }
        iVar11 = rd_contents_init(a,GZIP,local_15c,0);
        if (iVar11 != 0) {
          return iVar11;
        }
        lVar17 = xmlReaderForIO(xml2_read_cb,xml2_close_cb,a,0,0,0);
        if (lVar17 == 0) {
          pcVar28 = "Couldn\'t allocate memory for xml parser";
          iVar11 = 0xc;
          goto LAB_00132506;
        }
        local_178 = entry;
        xmlTextReaderSetErrorHandler(lVar17,xml2_error_hdr,a);
switchD_00132ab6_caseD_c:
        iVar11 = xmlTextReaderRead(lVar17);
        if (iVar11 == 1) {
          iVar11 = xmlTextReaderNodeType(lVar17);
          pcVar28 = (char *)xmlTextReaderConstLocalName(lVar17);
          if (iVar11 == 0xf) goto LAB_00132ac1;
          if (iVar11 == 3) {
            __s = (byte *)xmlTextReaderConstValue(lVar17);
            pcVar28 = (char *)strlen((char *)__s);
            pvVar14 = a->format->data;
            iVar11 = *(int *)((long)pvVar14 + 0x28);
            lVar33 = 0x50;
            if (iVar11 == 5) {
LAB_00132a74:
              uVar16 = atol10((char *)__s,(size_t)pcVar28);
              *(uint64_t *)((long)pvVar14 + lVar33) = uVar16;
            }
            else if (iVar11 == 6) {
              lVar33 = 0x58;
              goto LAB_00132a74;
            }
            lVar33 = *(long *)((long)pvVar14 + 0x1a0);
            if (lVar33 != 0) {
              switch(iVar11) {
              case 9:
                *(byte *)(lVar33 + 0x1c) = *(byte *)(lVar33 + 0x1c) | 1;
                uVar16 = atol10((char *)__s,(size_t)pcVar28);
                *(uint64_t *)(lVar33 + 0x28) = uVar16;
                goto switchD_00132ab6_caseD_c;
              case 10:
                *(byte *)(lVar33 + 0x1c) = *(byte *)(lVar33 + 0x1c) | 1;
                uVar16 = atol10((char *)__s,(size_t)pcVar28);
                *(uint64_t *)(lVar33 + 0x30) = uVar16;
                goto switchD_00132ab6_caseD_c;
              case 0xb:
                *(byte *)(lVar33 + 0x1c) = *(byte *)(lVar33 + 0x1c) | 1;
                uVar16 = atol10((char *)__s,(size_t)pcVar28);
                *(uint64_t *)(lVar33 + 0x38) = uVar16;
              default:
                goto switchD_00132ab6_caseD_c;
              case 0xd:
                sVar29 = atohex((uchar *)(lVar33 + 0x58),(size_t)__s,pcVar28,0x1736d4);
                *(size_t *)(*(long *)((long)pvVar14 + 0x1a0) + 0x50) = sVar29;
                goto switchD_00132ab6_caseD_c;
              case 0xe:
                sVar29 = atohex((uchar *)(lVar33 + 0x80),(size_t)__s,pcVar28,0x1736d4);
                *(size_t *)(*(long *)((long)pvVar14 + 0x1a0) + 0x78) = sVar29;
                goto switchD_00132ab6_caseD_c;
              case 0x11:
                *(byte *)(lVar33 + 0x1d) = *(byte *)(lVar33 + 0x1d) | 0x20;
                uVar16 = atol10((char *)__s,(size_t)pcVar28);
                *(uint64_t *)(*(long *)((long)pvVar14 + 0x1a8) + 0x28) = uVar16;
                goto switchD_00132ab6_caseD_c;
              case 0x12:
                *(byte *)(lVar33 + 0x1d) = *(byte *)(lVar33 + 0x1d) | 0x20;
                uVar16 = atol10((char *)__s,(size_t)pcVar28);
                *(uint64_t *)(*(long *)((long)pvVar14 + 0x1a8) + 0x30) = uVar16;
                goto switchD_00132ab6_caseD_c;
              case 0x13:
                *(byte *)(lVar33 + 0x1d) = *(byte *)(lVar33 + 0x1d) | 0x20;
                uVar16 = atol10((char *)__s,(size_t)pcVar28);
                *(uint64_t *)(*(long *)((long)pvVar14 + 0x1a8) + 0x38) = uVar16;
                goto switchD_00132ab6_caseD_c;
              case 0x15:
                *(byte *)(lVar33 + 0x1d) = *(byte *)(lVar33 + 0x1d) | 0x20;
                sVar29 = atohex((uchar *)(*(long *)((long)pvVar14 + 0x1a8) + 0x58),(size_t)__s,
                                pcVar28,0x1736d4);
                *(size_t *)(*(long *)((long)pvVar14 + 0x1a8) + 0x50) = sVar29;
                goto switchD_00132ab6_caseD_c;
              case 0x16:
                *(byte *)(lVar33 + 0x1d) = *(byte *)(lVar33 + 0x1d) | 0x20;
                sVar29 = atohex((uchar *)(*(long *)((long)pvVar14 + 0x1a8) + 0x80),(size_t)__s,
                                pcVar28,0x1736d4);
                *(size_t *)(*(long *)((long)pvVar14 + 0x1a8) + 0x78) = sVar29;
                goto switchD_00132ab6_caseD_c;
              case 0x17:
                *(byte *)(lVar33 + 0x1d) = *(byte *)(lVar33 + 0x1d) | 0x20;
                lVar33 = *(long *)((long)pvVar14 + 0x1a8);
                *(undefined8 *)(lVar33 + 0x10) = 0;
                as = (archive_string *)(lVar33 + 8);
                break;
              case 0x18:
                *(byte *)(lVar33 + 0x1d) = *(byte *)(lVar33 + 0x1d) | 0x20;
                lVar33 = *(long *)((long)pvVar14 + 0x1a8);
                *(undefined8 *)(lVar33 + 0xa0) = 0;
                as = (archive_string *)(lVar33 + 0x98);
                break;
              case 0x19:
                *(uint *)(lVar33 + 0x1c) = *(uint *)(lVar33 + 0x1c) | 0x8008;
                tVar19 = parse_time((char *)__s,(size_t)pcVar28);
                *(time_t *)(*(long *)((long)pvVar14 + 0x1a0) + 200) = tVar19;
                goto switchD_00132ab6_caseD_c;
              case 0x1a:
                *(uint *)(lVar33 + 0x1c) = *(uint *)(lVar33 + 0x1c) | 0x10008;
                tVar19 = parse_time((char *)__s,(size_t)pcVar28);
                *(time_t *)(*(long *)((long)pvVar14 + 0x1a0) + 0xd0) = tVar19;
                goto switchD_00132ab6_caseD_c;
              case 0x1b:
                *(uint *)(lVar33 + 0x1c) = *(uint *)(lVar33 + 0x1c) | 0x20008;
                tVar19 = parse_time((char *)__s,(size_t)pcVar28);
                *(time_t *)(*(long *)((long)pvVar14 + 0x1a0) + 0xd8) = tVar19;
                goto switchD_00132ab6_caseD_c;
              case 0x1c:
                *(byte *)(lVar33 + 0x1c) = *(byte *)(lVar33 + 0x1c) | 0x20;
                *(undefined8 *)(lVar33 + 0x108) = 0;
                as = (archive_string *)(lVar33 + 0x100);
                break;
              case 0x1d:
                *(byte *)(lVar33 + 0x1c) = *(byte *)(lVar33 + 0x1c) | 0x20;
                uVar16 = atol10((char *)__s,(size_t)pcVar28);
                *(uint64_t *)(lVar33 + 0x118) = uVar16;
                goto switchD_00132ab6_caseD_c;
              case 0x1e:
                *(byte *)(lVar33 + 0x1c) = *(byte *)(lVar33 + 0x1c) | 0x10;
                *(undefined8 *)(lVar33 + 0xe8) = 0;
                as = (archive_string *)(lVar33 + 0xe0);
                break;
              case 0x1f:
                *(byte *)(lVar33 + 0x1c) = *(byte *)(lVar33 + 0x1c) | 0x10;
                uVar16 = atol10((char *)__s,(size_t)pcVar28);
                *(uint64_t *)(lVar33 + 0xf8) = uVar16;
                goto switchD_00132ab6_caseD_c;
              case 0x20:
                *(byte *)(lVar33 + 0x1c) = *(byte *)(lVar33 + 0x1c) | 0x40;
                if (pcVar28 == (char *)0x0) {
                  uVar8 = 0;
                }
                else {
                  uVar8 = 0;
                  for (pcVar18 = (char *)0x0;
                      (pcVar28 != pcVar18 && ((__s[(long)pcVar18] & 0xf8) == 0x30));
                      pcVar18 = pcVar18 + 1) {
                    uVar8 = (uint)(byte)(__s[(long)pcVar18] - 0x30) + uVar8 * 8;
                  }
                  uVar8 = uVar8 & 0xffff0fff;
                }
                *(uint *)(lVar33 + 0x120) = *(uint *)(lVar33 + 0x120) & 0xf000 | uVar8;
                goto switchD_00132ab6_caseD_c;
              case 0x22:
                *(byte *)(lVar33 + 0x1d) = *(byte *)(lVar33 + 0x1d) | 2;
                uVar16 = atol10((char *)__s,(size_t)pcVar28);
                *(uint64_t *)(lVar33 + 0x130) = uVar16;
                goto switchD_00132ab6_caseD_c;
              case 0x23:
                *(byte *)(lVar33 + 0x1d) = *(byte *)(lVar33 + 0x1d) | 4;
                uVar16 = atol10((char *)__s,(size_t)pcVar28);
                *(uint64_t *)(lVar33 + 0x138) = uVar16;
                goto switchD_00132ab6_caseD_c;
              case 0x24:
                *(byte *)(lVar33 + 0x1d) = *(byte *)(lVar33 + 0x1d) | 1;
                uVar16 = atol10((char *)__s,(size_t)pcVar28);
                *(uint64_t *)(lVar33 + 0x128) = uVar16;
                goto switchD_00132ab6_caseD_c;
              case 0x25:
                *(byte *)(lVar33 + 0x1d) = *(byte *)(lVar33 + 0x1d) | 8;
                uVar16 = atol10((char *)__s,(size_t)pcVar28);
                *(uint64_t *)(lVar33 + 0x140) = uVar16;
                goto switchD_00132ab6_caseD_c;
              case 0x26:
                *(byte *)(lVar33 + 0x1c) = *(byte *)(lVar33 + 0x1c) | 4;
                *(undefined8 *)(lVar33 + 0xb8) = 0;
                as = (archive_string *)(lVar33 + 0xb0);
                break;
              case 0x27:
                iVar11 = is_string("file",(char *)__s,(size_t)pcVar28);
                if ((iVar11 == 0) ||
                   (iVar11 = is_string("hardlink",(char *)__s,(size_t)pcVar28), iVar11 == 0)) {
                  *(uint *)(lVar33 + 0x120) = *(uint *)(lVar33 + 0x120) & 0xffff0fff | 0x8000;
                }
                iVar11 = is_string("directory",(char *)__s,(size_t)pcVar28);
                if (iVar11 == 0) {
                  *(uint *)(lVar33 + 0x120) = *(uint *)(lVar33 + 0x120) & 0xffff0fff | 0x4000;
                }
                iVar11 = is_string("symlink",(char *)__s,(size_t)pcVar28);
                if (iVar11 == 0) {
                  *(uint *)(lVar33 + 0x120) = *(uint *)(lVar33 + 0x120) & 0xffff0fff | 0xa000;
                }
                iVar11 = is_string("character special",(char *)__s,(size_t)pcVar28);
                if (iVar11 == 0) {
                  *(uint *)(lVar33 + 0x120) = *(uint *)(lVar33 + 0x120) & 0xffff0fff | 0x2000;
                }
                iVar11 = is_string("block special",(char *)__s,(size_t)pcVar28);
                if (iVar11 == 0) {
                  *(uint *)(lVar33 + 0x120) = *(uint *)(lVar33 + 0x120) & 0xffff0fff | 0x6000;
                }
                iVar11 = is_string("socket",(char *)__s,(size_t)pcVar28);
                if (iVar11 == 0) {
                  *(uint *)(lVar33 + 0x120) = *(uint *)(lVar33 + 0x120) & 0xffff0fff | 0xc000;
                }
                iVar11 = is_string("fifo",(char *)__s,(size_t)pcVar28);
                if (iVar11 == 0) {
                  *(uint *)(lVar33 + 0x120) = *(uint *)(lVar33 + 0x120) & 0xffff0fff | 0x1000;
                }
                *(byte *)(lVar33 + 0x1c) = *(byte *)(lVar33 + 0x1c) | 0x80;
                goto switchD_00132ab6_caseD_c;
              case 0x28:
                uVar8 = *(uint *)(lVar33 + 0x1c);
                if ((uVar8 & 2) != 0) goto switchD_00132ab6_caseD_c;
                if (*(long *)(lVar33 + 0x10) != 0) {
                  archive_string_concat
                            ((archive_string *)(lVar33 + 0x98),
                             (archive_string *)(*(long *)(lVar33 + 0x10) + 0x98));
                  archive_strappend_char
                            ((archive_string *)(*(long *)((long)pvVar14 + 0x1a0) + 0x98),'/');
                  lVar33 = *(long *)((long)pvVar14 + 0x1a0);
                  uVar8 = *(uint *)(lVar33 + 0x1c);
                }
                *(uint *)(lVar33 + 0x1c) = uVar8 | 2;
                as = (archive_string *)(lVar33 + 0x98);
                if (*(int *)((long)pvVar14 + 0x38) != 0) {
                  _p = &d;
                  sVar29 = 0;
                  do {
                    n = sVar29;
                    if (((pcVar28 == (char *)0x0) || (base64[*__s] < 0)) || (base64[__s[1]] < 0))
                    goto LAB_001331c0;
                    pbVar36 = __s + 2;
                    iVar11 = base64[__s[1]] << 0xc;
                    *(byte *)_p = (byte)((uint)(base64[*__s] << 0x12) >> 0x10) |
                                  (byte)((uint)iVar11 >> 0x10);
                    if (pcVar28 == (char *)0x2) {
                      _p = (void **)((long)_p + 1);
                      sVar29 = sVar29 + 1;
LAB_0013314e:
                      pcVar28 = (char *)0x0;
                    }
                    else {
                      bVar1 = *pbVar36;
                      n = sVar29 + 1;
                      if (base64[bVar1] < 0) goto LAB_001331c0;
                      pbVar36 = __s + 3;
                      iVar27 = base64[bVar1] << 6;
                      *(byte *)((long)_p + 1) =
                           (byte)((uint)iVar11 >> 8) | (byte)((uint)iVar27 >> 8);
                      if (pcVar28 == (char *)0x3) {
                        _p = (void **)((long)_p + 2);
                        sVar29 = sVar29 + 2;
                        goto LAB_0013314e;
                      }
                      bVar1 = *pbVar36;
                      n = sVar29 + 2;
                      if (base64[bVar1] < 0) goto LAB_001331c0;
                      pbVar36 = __s + 4;
                      *(byte *)((long)_p + 2) = (byte)base64[bVar1] | (byte)iVar27;
                      _p = (void **)((long)_p + 3);
                      sVar29 = sVar29 + 3;
                      pcVar28 = pcVar28 + -4;
                    }
                    __s = pbVar36;
                    if (sVar29 - 0xfd < 0xffffffffffffff00) {
                      _p = &d;
                      archive_strncat(as,_p,sVar29);
                      sVar29 = 0;
                    }
                  } while( true );
                }
                break;
              case 0x2a:
              case 0x2b:
              case 0x2c:
                *(byte *)(lVar33 + 0x1d) = *(byte *)(lVar33 + 0x1d) | 0x40;
                goto switchD_00132ab6_caseD_c;
              }
              archive_strncat(as,__s,(size_t)pcVar28);
            }
          }
          else if (iVar11 == 1) {
            local_14c = xmlTextReaderIsEmptyElement(lVar17);
            outbytes = 0;
            local_180 = (xmlattr *)&outbytes;
            iVar11 = xmlTextReaderMoveToFirstAttribute(lVar17);
            while (iVar11 == 1) {
              __ptr = (xmlattr *)malloc(0x18);
              if (__ptr == (xmlattr *)0x0) goto LAB_00132b26;
              pcVar18 = (char *)xmlTextReaderConstLocalName(lVar17);
              pcVar18 = strdup(pcVar18);
              __ptr->name = pcVar18;
              if (pcVar18 == (char *)0x0) {
LAB_00132b1e:
                free(__ptr);
                goto LAB_00132b26;
              }
              pcVar18 = (char *)xmlTextReaderConstValue(lVar17);
              pcVar18 = strdup(pcVar18);
              __ptr->value = pcVar18;
              if (pcVar18 == (char *)0x0) {
                free(__ptr->name);
                goto LAB_00132b1e;
              }
              __ptr->next = (xmlattr *)0x0;
              local_180->next = __ptr;
              local_180 = __ptr;
              iVar11 = xmlTextReaderMoveToNextAttribute(lVar17);
            }
            puVar37 = (undefined8 *)outbytes;
            if (iVar11 != 0) goto LAB_00132b44;
            xar = (xar *)a->format->data;
            xar->base64text = 0;
            switch(xar->xmlsts) {
            case INIT:
              iVar11 = strcmp(pcVar28,"xar");
              if (iVar11 != 0) goto LAB_00132aff;
              xar->xmlsts = XAR;
              break;
            case XAR:
              iVar11 = strcmp(pcVar28,"toc");
              if (iVar11 != 0) goto LAB_00132aff;
              xar->xmlsts = TOC;
              break;
            case TOC:
              iVar11 = strcmp(pcVar28,"creation-time");
              if (iVar11 == 0) {
                xar->xmlsts = TOC_CREATION_TIME;
              }
              else {
                iVar11 = strcmp(pcVar28,"checksum");
                if (iVar11 == 0) {
                  xar->xmlsts = TOC_CHECKSUM;
                }
                else {
                  iVar11 = strcmp(pcVar28,"file");
                  if (iVar11 != 0) goto LAB_00132aff;
                  iVar27 = file_new(a,xar,(xmlattr_list *)&outbytes);
                  iVar11 = -0x1e;
                  puVar37 = (undefined8 *)outbytes;
                  if (iVar27 != 0) goto LAB_00132b44;
                  xar->xmlsts = TOC_FILE;
                }
              }
              break;
            case TOC_CREATION_TIME:
            case TOC_CHECKSUM_OFFSET:
            case TOC_CHECKSUM_SIZE:
            case FILE_DATA_LENGTH:
            case FILE_DATA_OFFSET:
            case FILE_DATA_SIZE:
            case FILE_DATA_ENCODING:
            case FILE_DATA_A_CHECKSUM:
            case FILE_DATA_E_CHECKSUM:
            case FILE_DATA_CONTENT:
            case FILE_EA_LENGTH:
            case FILE_EA_OFFSET:
            case FILE_EA_SIZE:
            case FILE_EA_ENCODING:
            case FILE_EA_A_CHECKSUM:
            case FILE_EA_E_CHECKSUM:
            case FILE_EA_NAME:
            case FILE_EA_FSTYPE:
            case FILE_CTIME:
            case FILE_MTIME:
            case FILE_ATIME:
            case FILE_GROUP:
            case FILE_GID:
            case FILE_USER:
            case FILE_UID:
            case FILE_MODE:
            case FILE_DEVICE_MAJOR:
            case FILE_DEVICE_MINOR:
            case FILE_DEVICENO:
            case FILE_INODE:
            case FILE_LINK:
            case FILE_TYPE:
            case FILE_NAME:
            case FILE_ACL_DEFAULT:
            case FILE_ACL_ACCESS:
            case FILE_ACL_APPLEEXTENDED:
            case FILE_FLAGS_USER_NODUMP:
            case FILE_FLAGS_USER_IMMUTABLE:
            case FILE_FLAGS_USER_APPEND:
            case FILE_FLAGS_USER_OPAQUE:
            case FILE_FLAGS_USER_NOUNLINK:
            case FILE_FLAGS_SYS_ARCHIVED:
            case FILE_FLAGS_SYS_IMMUTABLE:
            case FILE_FLAGS_SYS_APPEND:
            case FILE_FLAGS_SYS_NOUNLINK:
            case FILE_FLAGS_SYS_SNAPSHOT:
            case FILE_EXT2_SecureDeletion:
            case FILE_EXT2_Undelete:
            case FILE_EXT2_Compress:
            case FILE_EXT2_Synchronous:
            case FILE_EXT2_Immutable:
            case FILE_EXT2_AppendOnly:
            case FILE_EXT2_NoDump:
            case FILE_EXT2_NoAtime:
            case FILE_EXT2_CompDirty:
            case FILE_EXT2_CompBlock:
            case FILE_EXT2_NoCompBlock:
            case FILE_EXT2_CompError:
            case FILE_EXT2_BTree:
            case FILE_EXT2_HashIndexed:
            case FILE_EXT2_iMagic:
            case FILE_EXT2_Journaled:
            case FILE_EXT2_NoTail:
            case FILE_EXT2_DirSync:
            case FILE_EXT2_TopDir:
            case FILE_EXT2_Reserved:
            case UNKNOWN:
LAB_00132aff:
              iVar27 = unknowntag_start(a,xar,pcVar28);
LAB_00132b08:
              iVar11 = -0x1e;
              puVar37 = (undefined8 *)outbytes;
              if (iVar27 != 0) goto LAB_00132b44;
              break;
            case TOC_CHECKSUM:
              iVar11 = strcmp(pcVar28,"offset");
              if (iVar11 == 0) {
                xar->xmlsts = TOC_CHECKSUM_OFFSET;
              }
              else {
                iVar11 = strcmp(pcVar28,"size");
                if (iVar11 != 0) goto LAB_00132aff;
                xar->xmlsts = TOC_CHECKSUM_SIZE;
              }
              break;
            case TOC_FILE:
              iVar11 = strcmp(pcVar28,"file");
              if (iVar11 == 0) {
                iVar27 = file_new(a,xar,(xmlattr_list *)&outbytes);
                goto LAB_00132b08;
              }
              iVar11 = strcmp(pcVar28,"data");
              if (iVar11 == 0) {
                xar->xmlsts = FILE_DATA;
              }
              else if (((*pcVar28 == 'e') && (pcVar28[1] == 'a')) && (pcVar28[2] == '\0')) {
                pxVar20 = (xattr *)calloc(1,0xb0);
                if (pxVar20 == (xattr *)0x0) {
LAB_00132b26:
                  iVar11 = 0xc;
                  pcVar18 = "Out of memory";
LAB_00132b33:
                  archive_set_error(&a->archive,iVar11,pcVar18);
                  iVar11 = -0x1e;
                  puVar37 = (undefined8 *)outbytes;
                  goto LAB_00132b44;
                }
                xar->xattr = pxVar20;
                uVar21 = 0;
                psVar30 = &outbytes;
                while (psVar30 = (size_t *)*psVar30, psVar30 != (size_t *)0x0) {
                  pcVar18 = (char *)psVar30[1];
                  if (((*pcVar18 == 'i') && (pcVar18[1] == 'd')) && (pcVar18[2] == '\0')) {
                    pcVar18 = (char *)psVar30[2];
                    sVar22 = strlen(pcVar18);
                    uVar21 = atol10(pcVar18,sVar22);
                    pxVar20->id = uVar21;
                  }
                }
                pxVar6 = (xattr *)&xar->file->xattr_list;
                do {
                  pxVar26 = pxVar6;
                  pxVar6 = pxVar26->next;
                  if (pxVar6 == (xattr *)0x0) break;
                } while (pxVar6->id <= uVar21);
                pxVar20->next = pxVar6;
                pxVar26->next = pxVar20;
                xar->xmlsts = FILE_EA;
              }
              else {
                iVar11 = strcmp(pcVar28,"ctime");
                if (iVar11 == 0) {
                  xar->xmlsts = FILE_CTIME;
                }
                else {
                  iVar11 = strcmp(pcVar28,"mtime");
                  if (iVar11 == 0) {
                    xar->xmlsts = FILE_MTIME;
                  }
                  else {
                    iVar11 = strcmp(pcVar28,"atime");
                    if (iVar11 == 0) {
                      xar->xmlsts = FILE_ATIME;
                    }
                    else {
                      iVar11 = strcmp(pcVar28,"group");
                      if (iVar11 == 0) {
                        xar->xmlsts = FILE_GROUP;
                      }
                      else {
                        iVar11 = strcmp(pcVar28,"gid");
                        if (iVar11 == 0) {
                          xar->xmlsts = FILE_GID;
                        }
                        else {
                          iVar11 = strcmp(pcVar28,"user");
                          if (iVar11 == 0) {
                            xar->xmlsts = FILE_USER;
                          }
                          else {
                            iVar11 = strcmp(pcVar28,"uid");
                            if (iVar11 == 0) {
                              xar->xmlsts = FILE_UID;
                            }
                            else {
                              iVar11 = strcmp(pcVar28,"mode");
                              if (iVar11 == 0) {
                                xar->xmlsts = FILE_MODE;
                              }
                              else {
                                iVar11 = strcmp(pcVar28,"device");
                                if (iVar11 == 0) {
                                  xar->xmlsts = FILE_DEVICE;
                                }
                                else {
                                  iVar11 = strcmp(pcVar28,"deviceno");
                                  if (iVar11 == 0) {
                                    xar->xmlsts = FILE_DEVICENO;
                                  }
                                  else {
                                    iVar11 = strcmp(pcVar28,"inode");
                                    if (iVar11 == 0) {
                                      xar->xmlsts = FILE_INODE;
                                    }
                                    else {
                                      iVar11 = strcmp(pcVar28,"link");
                                      if (iVar11 == 0) {
                                        xar->xmlsts = FILE_LINK;
                                      }
                                      else {
                                        iVar11 = strcmp(pcVar28,"type");
                                        if (iVar11 == 0) {
                                          xar->xmlsts = FILE_TYPE;
                                          local_148 = (hdlink *)&xar->hdlink_list;
                                          psVar30 = &outbytes;
LAB_00133dfe:
                                          psVar30 = (size_t *)*psVar30;
                                          if (psVar30 != (size_t *)0x0) {
                                            iVar11 = strcmp((char *)psVar30[1],"link");
                                            if (iVar11 == 0) {
                                              local_170 = xar->file;
                                              if (((local_170->hdnext != (xar_file *)0x0) ||
                                                  (local_170->link != 0)) ||
                                                 (pxVar25 = xar->hdlink_orgs, local_170 == pxVar25))
                                              {
                                                iVar11 = -1;
                                                pcVar18 = "File with multiple link attributes";
                                                goto LAB_00132b33;
                                              }
                                              pcVar18 = (char *)psVar30[2];
                                              iVar11 = strcmp(pcVar18,"original");
                                              if (iVar11 == 0) {
                                                local_170->hdnext = pxVar25;
                                                xar->hdlink_orgs = local_170;
                                              }
                                              else {
                                                sVar22 = strlen(pcVar18);
                                                uVar16 = atol10(pcVar18,sVar22);
                                                uVar8 = (uint)uVar16;
                                                local_170->link = uVar8;
                                                phVar23 = local_148;
                                                if (uVar8 != 0) {
                                                  do {
                                                    phVar23 = phVar23->next;
                                                    if (phVar23 == (hdlink *)0x0) {
                                                      phVar23 = (hdlink *)malloc(0x18);
                                                      if (phVar23 == (hdlink *)0x0)
                                                      goto LAB_00132b26;
                                                      local_170->hdnext = (xar_file *)0x0;
                                                      phVar23->id = uVar8;
                                                      phVar23->cnt = 1;
                                                      phVar23->files = local_170;
                                                      phVar23->next = local_148->next;
                                                      local_148->next = phVar23;
                                                      goto LAB_00133dfe;
                                                    }
                                                  } while (phVar23->id != uVar8);
                                                  local_170->hdnext = phVar23->files;
                                                  phVar23->cnt = phVar23->cnt + 1;
                                                  phVar23->files = local_170;
                                                }
                                              }
                                            }
                                            goto LAB_00133dfe;
                                          }
                                        }
                                        else {
                                          iVar11 = strcmp(pcVar28,"name");
                                          if (iVar11 == 0) {
                                            xar->xmlsts = FILE_NAME;
                                            psVar30 = &outbytes;
                                            while (psVar30 = (size_t *)*psVar30,
                                                  psVar30 != (size_t *)0x0) {
                                              iVar11 = strcmp((char *)psVar30[1],"enctype");
                                              if ((iVar11 == 0) &&
                                                 (iVar11 = strcmp((char *)psVar30[2],"base64"),
                                                 iVar11 == 0)) {
                                                xar->base64text = 1;
                                              }
                                            }
                                          }
                                          else {
                                            iVar11 = strcmp(pcVar28,"acl");
                                            if (iVar11 == 0) {
                                              xar->xmlsts = FILE_ACL;
                                            }
                                            else {
                                              iVar11 = strcmp(pcVar28,"flags");
                                              if (iVar11 == 0) {
                                                xar->xmlsts = FILE_FLAGS;
                                              }
                                              else {
                                                iVar11 = strcmp(pcVar28,"ext2");
                                                if (iVar11 != 0) goto LAB_00132aff;
                                                xar->xmlsts = FILE_EXT2;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              break;
            case FILE_DATA:
              iVar11 = strcmp(pcVar28,"length");
              if (iVar11 == 0) {
                xar->xmlsts = FILE_DATA_LENGTH;
              }
              else {
                iVar11 = strcmp(pcVar28,"offset");
                if (iVar11 == 0) {
                  xar->xmlsts = FILE_DATA_OFFSET;
                }
                else {
                  iVar11 = strcmp(pcVar28,"size");
                  if (iVar11 == 0) {
                    xar->xmlsts = FILE_DATA_SIZE;
                  }
                  else {
                    iVar11 = strcmp(pcVar28,"encoding");
                    if (iVar11 == 0) {
                      xar->xmlsts = FILE_DATA_ENCODING;
                      eVar12 = getencoding((xmlattr_list *)&outbytes);
                      pxVar25 = xar->file;
LAB_00133c53:
                      pxVar25->encoding = eVar12;
                    }
                    else {
                      iVar11 = strcmp(pcVar28,"archived-checksum");
                      if (iVar11 == 0) {
                        xar->xmlsts = FILE_DATA_A_CHECKSUM;
                        iVar11 = getsumalgorithm((xmlattr_list *)&outbytes);
                        (xar->file->a_sum).alg = iVar11;
                      }
                      else {
                        iVar11 = strcmp(pcVar28,"extracted-checksum");
                        if (iVar11 == 0) {
                          xar->xmlsts = FILE_DATA_E_CHECKSUM;
                          iVar11 = getsumalgorithm((xmlattr_list *)&outbytes);
                          (xar->file->e_sum).alg = iVar11;
                        }
                        else {
                          iVar11 = strcmp(pcVar28,"content");
                          if (iVar11 != 0) goto LAB_00132aff;
                          xar->xmlsts = FILE_DATA_CONTENT;
                        }
                      }
                    }
                  }
                }
              }
              break;
            case FILE_EA:
              iVar11 = strcmp(pcVar28,"length");
              if (iVar11 == 0) {
                xar->xmlsts = FILE_EA_LENGTH;
              }
              else {
                iVar11 = strcmp(pcVar28,"offset");
                if (iVar11 == 0) {
                  xar->xmlsts = FILE_EA_OFFSET;
                }
                else {
                  iVar11 = strcmp(pcVar28,"size");
                  if (iVar11 == 0) {
                    xar->xmlsts = FILE_EA_SIZE;
                  }
                  else {
                    iVar11 = strcmp(pcVar28,"encoding");
                    if (iVar11 == 0) {
                      xar->xmlsts = FILE_EA_ENCODING;
                      eVar12 = getencoding((xmlattr_list *)&outbytes);
                      pxVar25 = (xar_file *)xar->xattr;
                      goto LAB_00133c53;
                    }
                    iVar11 = strcmp(pcVar28,"archived-checksum");
                    if (iVar11 == 0) {
                      xar->xmlsts = FILE_EA_A_CHECKSUM;
                    }
                    else {
                      iVar11 = strcmp(pcVar28,"extracted-checksum");
                      if (iVar11 == 0) {
                        xar->xmlsts = FILE_EA_E_CHECKSUM;
                      }
                      else {
                        iVar11 = strcmp(pcVar28,"name");
                        if (iVar11 == 0) {
                          xar->xmlsts = FILE_EA_NAME;
                        }
                        else {
                          iVar11 = strcmp(pcVar28,"fstype");
                          if (iVar11 != 0) goto LAB_00132aff;
                          xar->xmlsts = FILE_EA_FSTYPE;
                        }
                      }
                    }
                  }
                }
              }
              break;
            case FILE_DEVICE:
              iVar11 = strcmp(pcVar28,"major");
              if (iVar11 == 0) {
                xar->xmlsts = FILE_DEVICE_MAJOR;
              }
              else {
                iVar11 = strcmp(pcVar28,"minor");
                if (iVar11 != 0) goto LAB_00132aff;
                xar->xmlsts = FILE_DEVICE_MINOR;
              }
              break;
            case FILE_ACL:
              iVar11 = strcmp(pcVar28,"appleextended");
              if (iVar11 == 0) {
                xar->xmlsts = FILE_ACL_APPLEEXTENDED;
              }
              else {
                iVar11 = strcmp(pcVar28,"default");
                if (iVar11 == 0) {
                  xar->xmlsts = FILE_ACL_DEFAULT;
                }
                else {
                  iVar11 = strcmp(pcVar28,"access");
                  if (iVar11 != 0) goto LAB_00132aff;
                  xar->xmlsts = FILE_ACL_ACCESS;
                }
              }
              break;
            case FILE_FLAGS:
              iVar11 = strcmp(pcVar28,"UserNoDump");
              xVar24 = FILE_FLAGS_USER_NODUMP;
              pcVar18 = "nodump";
              if (iVar11 != 0) {
                iVar11 = strcmp(pcVar28,"UserImmutable");
                xVar24 = FILE_FLAGS_USER_IMMUTABLE;
                pcVar18 = "uimmutable";
                if (iVar11 != 0) {
                  iVar11 = strcmp(pcVar28,"UserAppend");
                  xVar24 = FILE_FLAGS_USER_APPEND;
                  pcVar18 = "uappend";
                  if (iVar11 != 0) {
                    iVar11 = strcmp(pcVar28,"UserOpaque");
                    xVar24 = FILE_FLAGS_USER_OPAQUE;
                    pcVar18 = "opaque";
                    if (iVar11 != 0) {
                      iVar11 = strcmp(pcVar28,"UserNoUnlink");
                      xVar24 = FILE_FLAGS_USER_NOUNLINK;
                      pcVar18 = "nouunlink";
                      if (iVar11 != 0) {
                        iVar11 = strcmp(pcVar28,"SystemArchived");
                        xVar24 = FILE_FLAGS_SYS_ARCHIVED;
                        pcVar18 = "archived";
                        if (iVar11 != 0) {
                          iVar11 = strcmp(pcVar28,"SystemImmutable");
                          xVar24 = FILE_FLAGS_SYS_IMMUTABLE;
                          pcVar18 = "simmutable";
                          if (iVar11 != 0) {
                            iVar11 = strcmp(pcVar28,"SystemAppend");
                            xVar24 = FILE_FLAGS_SYS_APPEND;
                            pcVar18 = "sappend";
                            if (iVar11 != 0) {
                              iVar11 = strcmp(pcVar28,"SystemNoUnlink");
                              xVar24 = FILE_FLAGS_SYS_NOUNLINK;
                              pcVar18 = "nosunlink";
                              if (iVar11 != 0) {
                                iVar11 = strcmp(pcVar28,"SystemSnapshot");
                                xVar24 = FILE_FLAGS_SYS_SNAPSHOT;
                                pcVar18 = "snapshot";
                                if (iVar11 != 0) goto LAB_00132aff;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              xar->xmlsts = xVar24;
              pxVar25 = xar->file;
              pxVar25->has = pxVar25->has | 0x1000;
              goto LAB_00133b0b;
            case FILE_EXT2:
              iVar11 = strcmp(pcVar28,"SecureDeletion");
              xVar24 = FILE_EXT2_SecureDeletion;
              pcVar18 = "securedeletion";
              if (iVar11 != 0) {
                iVar11 = strcmp(pcVar28,"Undelete");
                xVar24 = FILE_EXT2_Undelete;
                pcVar18 = "nouunlink";
                if (iVar11 != 0) {
                  iVar11 = strcmp(pcVar28,"Compress");
                  xVar24 = FILE_EXT2_Compress;
                  pcVar18 = "compress";
                  if (iVar11 != 0) {
                    iVar11 = strcmp(pcVar28,"Synchronous");
                    xVar24 = FILE_EXT2_Synchronous;
                    pcVar18 = "sync";
                    if (iVar11 != 0) {
                      iVar11 = strcmp(pcVar28,"Immutable");
                      xVar24 = FILE_EXT2_Immutable;
                      pcVar18 = "simmutable";
                      if (iVar11 != 0) {
                        iVar11 = strcmp(pcVar28,"AppendOnly");
                        xVar24 = FILE_EXT2_AppendOnly;
                        pcVar18 = "sappend";
                        if (iVar11 != 0) {
                          iVar11 = strcmp(pcVar28,"NoDump");
                          xVar24 = FILE_EXT2_NoDump;
                          pcVar18 = "nodump";
                          if (iVar11 != 0) {
                            iVar11 = strcmp(pcVar28,"NoAtime");
                            xVar24 = FILE_EXT2_NoAtime;
                            pcVar18 = "noatime";
                            if (iVar11 != 0) {
                              iVar11 = strcmp(pcVar28,"CompDirty");
                              xVar24 = FILE_EXT2_CompDirty;
                              pcVar18 = "compdirty";
                              if (iVar11 != 0) {
                                iVar11 = strcmp(pcVar28,"CompBlock");
                                xVar24 = FILE_EXT2_CompBlock;
                                pcVar18 = "comprblk";
                                if (iVar11 != 0) {
                                  iVar11 = strcmp(pcVar28,"NoCompBlock");
                                  xVar24 = FILE_EXT2_NoCompBlock;
                                  pcVar18 = "nocomprblk";
                                  if (iVar11 != 0) {
                                    iVar11 = strcmp(pcVar28,"CompError");
                                    xVar24 = FILE_EXT2_CompError;
                                    pcVar18 = "comperr";
                                    if (iVar11 != 0) {
                                      iVar11 = strcmp(pcVar28,"BTree");
                                      xVar24 = FILE_EXT2_BTree;
                                      pcVar18 = "btree";
                                      if (iVar11 != 0) {
                                        iVar11 = strcmp(pcVar28,"HashIndexed");
                                        xVar24 = FILE_EXT2_HashIndexed;
                                        pcVar18 = "hashidx";
                                        if (iVar11 != 0) {
                                          iVar11 = strcmp(pcVar28,"iMagic");
                                          xVar24 = FILE_EXT2_iMagic;
                                          pcVar18 = "imagic";
                                          if (iVar11 != 0) {
                                            iVar11 = strcmp(pcVar28,"Journaled");
                                            xVar24 = FILE_EXT2_Journaled;
                                            pcVar18 = "journal";
                                            if (iVar11 != 0) {
                                              iVar11 = strcmp(pcVar28,"NoTail");
                                              xVar24 = FILE_EXT2_NoTail;
                                              pcVar18 = "notail";
                                              if (iVar11 != 0) {
                                                iVar11 = strcmp(pcVar28,"DirSync");
                                                xVar24 = FILE_EXT2_DirSync;
                                                pcVar18 = "dirsync";
                                                if (iVar11 != 0) {
                                                  iVar11 = strcmp(pcVar28,"TopDir");
                                                  xVar24 = FILE_EXT2_TopDir;
                                                  pcVar18 = "topdir";
                                                  if (iVar11 != 0) {
                                                    iVar11 = strcmp(pcVar28,"Reserved");
                                                    xVar24 = FILE_EXT2_Reserved;
                                                    pcVar18 = "reserved";
                                                    if (iVar11 != 0) goto LAB_00132aff;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              xar->xmlsts = xVar24;
              pxVar25 = xar->file;
LAB_00133b0b:
              if ((pxVar25->fflags_text).length != 0) {
                archive_strappend_char(&pxVar25->fflags_text,',');
                pxVar25 = xar->file;
              }
              archive_strcat(&pxVar25->fflags_text,pcVar18);
            }
            iVar11 = 0;
            puVar37 = (undefined8 *)outbytes;
LAB_00132b44:
            while (puVar37 != (undefined8 *)0x0) {
              puVar5 = (undefined8 *)*puVar37;
              free((void *)puVar37[1]);
              free((void *)puVar37[2]);
              free(puVar37);
              puVar37 = puVar5;
            }
            outbytes = 0;
            local_180 = (xmlattr *)&outbytes;
            if (iVar11 != 0) {
              xmlFreeTextReader(lVar17);
              xmlCleanupParser();
              return iVar11;
            }
            if (local_14c != 0) {
              xml_end(a,pcVar28);
            }
          }
          goto switchD_00132ab6_caseD_c;
        }
        xmlFreeTextReader(lVar17);
        xmlCleanupParser();
        plVar32 = local_168;
        if (iVar11 != 0) {
          return -0x1e;
        }
        local_168[2] = *local_168;
        if (local_168[9] != local_140) {
          pcVar28 = "TOC uncompressed size error";
          iVar11 = -1;
          goto LAB_00132506;
        }
        if (local_15c != 0) {
          iVar11 = move_reading_point(a,local_168[10]);
          if (iVar11 != 0) {
            return iVar11;
          }
          pvVar14 = __archive_read_ahead(a,plVar32[0xb],(ssize_t *)&used);
          entry = local_178;
          if ((long)used < 0) goto LAB_0013408d;
          uVar21 = plVar32[0xb];
          if (used < uVar21) {
            pcVar28 = "Truncated archive file";
            iVar11 = 0x54;
            goto LAB_00132506;
          }
          iVar11 = checksum_final(a,pvVar14,uVar21,(void *)0x0,0);
          plVar32 = local_168;
          __archive_read_consume(a,local_168[0xb]);
          *plVar32 = *plVar32 + plVar32[0xb];
          if (iVar11 != 0) {
            return -0x1e;
          }
        }
        local_168 = plVar32 + 0x39;
        plVar32 = plVar32 + 0x38;
        while (lVar17 = *plVar32, plVar32 = local_168, lVar17 != 0) {
          do {
            plVar31 = plVar32;
            plVar32 = (long *)*plVar31;
            if (plVar32 == (long *)0x0) goto LAB_00134185;
          } while (*(ulong *)(lVar17 + 0x20) != (ulong)*(uint *)(plVar32 + 1));
          iVar11 = *(int *)((long)plVar32 + 0xc) + 1;
          *(int *)(lVar17 + 0x164) = iVar11;
          plVar32 = plVar32 + 2;
          while (lVar33 = *plVar32, lVar33 != 0) {
            *(int *)(lVar33 + 0x164) = iVar11;
            *(undefined8 *)(lVar33 + 0x170) = 0;
            archive_string_concat
                      ((archive_string *)(lVar33 + 0x168),(archive_string *)(lVar17 + 0x98));
            plVar32 = (long *)(lVar33 + 8);
          }
          plVar32 = (long *)*plVar31;
          *plVar31 = *plVar32;
          free(plVar32);
LAB_00134185:
          plVar32 = (long *)(lVar17 + 8);
        }
        (a->archive).archive_format = 0xa0000;
        (a->archive).archive_format_name = "xar";
        entry = local_178;
        goto LAB_0013224d;
      }
      pcVar28 = "Invalid header magic";
    }
    iVar11 = 0x54;
LAB_00132506:
    archive_set_error(&a->archive,iVar11,pcVar28);
    return -0x1e;
  }
LAB_0013408d:
  if ((int)used != 0) {
    return (int)used;
  }
LAB_0013224d:
  do {
    if (*(int *)((long)plVar2 + 0x1bc) < 1) {
      plVar2[0x34] = 0;
LAB_001323a6:
      *(undefined4 *)(plVar2 + 3) = 1;
      return 1;
    }
    puVar37 = (undefined8 *)plVar2[0x36];
    pxVar25 = (xar_file *)*puVar37;
    uVar8 = *(int *)((long)plVar2 + 0x1bc) - 1;
    *(uint *)((long)plVar2 + 0x1bc) = uVar8;
    *puVar37 = puVar37[uVar8];
    uVar21 = *(ulong *)(*(long *)plVar2[0x36] + 0x20);
    iVar11 = 0;
    while (iVar27 = iVar11 * 2 + 1, iVar27 < (int)uVar8) {
      lVar17 = plVar2[0x36];
      uVar34 = *(ulong *)(*(long *)(lVar17 + (long)iVar27 * 8) + 0x20);
      iVar35 = iVar11 * 2 + 2;
      if ((iVar35 < (int)uVar8) &&
         (uVar3 = *(ulong *)(*(long *)(lVar17 + (long)iVar35 * 8) + 0x20), uVar3 < uVar34)) {
        uVar34 = uVar3;
        iVar27 = iVar35;
      }
      if (uVar21 <= uVar34) break;
      uVar4 = *(undefined8 *)(lVar17 + (long)iVar11 * 8);
      *(undefined8 *)(lVar17 + (long)iVar11 * 8) = *(undefined8 *)(lVar17 + (long)iVar27 * 8);
      *(undefined8 *)(plVar2[0x36] + (long)iVar27 * 8) = uVar4;
      iVar11 = iVar27;
    }
    plVar2[0x34] = (long)pxVar25;
    if (pxVar25 == (xar_file *)0x0) goto LAB_001323a6;
    uVar8 = pxVar25->has;
    if (((pxVar25->mode & 0xf000) != 0x4000) || (uVar8 != 0x82)) {
      if ((uVar8 >> 0x11 & 1) != 0) {
        archive_entry_set_atime(entry,pxVar25->atime,0);
        uVar8 = pxVar25->has;
      }
      if ((short)uVar8 < 0) {
        archive_entry_set_ctime(entry,pxVar25->ctime,0);
        uVar8 = pxVar25->has;
      }
      if ((uVar8 >> 0x10 & 1) != 0) {
        archive_entry_set_mtime(entry,pxVar25->mtime,0);
      }
      archive_entry_set_gid(entry,pxVar25->gid);
      sVar29 = (pxVar25->gname).length;
      iVar11 = 0;
      if ((sVar29 != 0) &&
         (wVar9 = _archive_entry_copy_gname_l
                            (entry,(pxVar25->gname).s,sVar29,(archive_string_conv *)plVar2[0x4a]),
         wVar9 != L'\0')) {
        piVar15 = __errno_location();
        if (*piVar15 == 0xc) {
          pcVar28 = "Can\'t allocate memory for Gname";
          goto LAB_00132650;
        }
        iVar11 = -0x14;
        pcVar28 = archive_string_conversion_charset_name((archive_string_conv *)plVar2[0x4a]);
        archive_set_error(&a->archive,0x54,"Gname cannot be converted from %s to current locale.",
                          pcVar28);
      }
      archive_entry_set_uid(entry,pxVar25->uid);
      sVar29 = (pxVar25->uname).length;
      if ((sVar29 != 0) &&
         (wVar9 = _archive_entry_copy_uname_l
                            (entry,(pxVar25->uname).s,sVar29,(archive_string_conv *)plVar2[0x4a]),
         wVar9 != L'\0')) {
        piVar15 = __errno_location();
        if (*piVar15 == 0xc) {
          pcVar28 = "Can\'t allocate memory for Uname";
          goto LAB_00132650;
        }
        pcVar28 = archive_string_conversion_charset_name((archive_string_conv *)plVar2[0x4a]);
        archive_set_error(&a->archive,0x54,"Uname cannot be converted from %s to current locale.",
                          pcVar28);
        iVar11 = -0x14;
      }
      archive_entry_set_mode(entry,pxVar25->mode);
      wVar9 = _archive_entry_copy_pathname_l
                        (entry,(pxVar25->pathname).s,(pxVar25->pathname).length,
                         (archive_string_conv *)plVar2[0x4a]);
      if (wVar9 != L'\0') {
        piVar15 = __errno_location();
        if (*piVar15 == 0xc) {
          pcVar28 = "Can\'t allocate memory for Pathname";
          goto LAB_00132650;
        }
        pcVar28 = archive_string_conversion_charset_name((archive_string_conv *)plVar2[0x4a]);
        archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale."
                          ,pcVar28);
        iVar11 = -0x14;
      }
      sVar29 = (pxVar25->symlink).length;
      if ((sVar29 != 0) &&
         (wVar9 = _archive_entry_copy_symlink_l
                            (entry,(pxVar25->symlink).s,sVar29,(archive_string_conv *)plVar2[0x4a]),
         wVar9 != L'\0')) {
        piVar15 = __errno_location();
        if (*piVar15 == 0xc) {
          pcVar28 = "Can\'t allocate memory for Linkname";
LAB_00132650:
          archive_set_error(&a->archive,0xc,pcVar28);
          return -0x1e;
        }
        pcVar28 = archive_string_conversion_charset_name((archive_string_conv *)plVar2[0x4a]);
        archive_set_error(&a->archive,0x54,"Linkname cannot be converted from %s to current locale."
                          ,pcVar28);
        iVar11 = -0x14;
      }
      if ((pxVar25->mode & 0xf000) == 0x4000) {
        uVar8 = pxVar25->subdirs + 2;
      }
      else {
        uVar8 = pxVar25->nlink;
      }
      archive_entry_set_nlink(entry,uVar8);
      archive_entry_set_size(entry,pxVar25->size);
      if ((pxVar25->hardlink).length != 0) {
        archive_entry_set_hardlink(entry,(pxVar25->hardlink).s);
      }
      archive_entry_set_ino64(entry,pxVar25->ino64);
      uVar8 = pxVar25->has;
      if ((uVar8 >> 8 & 1) != 0) {
        archive_entry_set_dev(entry,pxVar25->dev);
        uVar8 = pxVar25->has;
      }
      if ((uVar8 >> 9 & 1) != 0) {
        archive_entry_set_devmajor(entry,pxVar25->devmajor);
        uVar8 = pxVar25->has;
      }
      if ((uVar8 >> 10 & 1) != 0) {
        archive_entry_set_devminor(entry,pxVar25->devminor);
      }
      local_178 = entry;
      if ((pxVar25->fflags_text).length != 0) {
        archive_entry_copy_fflags_text(entry,(pxVar25->fflags_text).s);
      }
      *(undefined4 *)(plVar2 + 0x3a) = 1;
      plVar2[0x3b] = 0;
      plVar2[0x3c] = pxVar25->length;
      plVar2[0x3e] = pxVar25->size;
      *(enctype *)(plVar2 + 0x3f) = pxVar25->encoding;
      plVar2[0x44] = *(long *)((pxVar25->a_sum).val + 0x10);
      lVar17 = *(long *)&pxVar25->a_sum;
      sVar29 = (pxVar25->a_sum).len;
      lVar33 = *(long *)((pxVar25->a_sum).val + 8);
      plVar2[0x42] = *(long *)(pxVar25->a_sum).val;
      plVar2[0x43] = lVar33;
      plVar2[0x40] = lVar17;
      plVar2[0x41] = sVar29;
      plVar2[0x49] = *(long *)((pxVar25->e_sum).val + 0x10);
      lVar17 = *(long *)&pxVar25->e_sum;
      sVar29 = (pxVar25->e_sum).len;
      lVar33 = *(long *)((pxVar25->e_sum).val + 8);
      plVar2[0x47] = *(long *)(pxVar25->e_sum).val;
      plVar2[0x48] = lVar33;
      plVar2[0x45] = lVar17;
      plVar2[0x46] = sVar29;
      pxVar20 = pxVar25->xattr_list;
      goto LAB_001327f9;
    }
    file_free(pxVar25);
  } while( true );
LAB_00132ac1:
  xml_end(a,pcVar28);
  goto switchD_00132ab6_caseD_c;
LAB_001331c0:
  if (n != 0) {
    archive_strncat(as,&d,n);
  }
  goto switchD_00132ab6_caseD_c;
LAB_001327f9:
  if (pxVar20 == (xattr *)0x0) {
    if (iVar11 == 0) {
      if (plVar2[0x3c] == 0) {
        iVar11 = 0;
      }
      else {
        iVar11 = move_reading_point(a,pxVar25->offset);
      }
    }
LAB_00132906:
    file_free(pxVar25);
    return iVar11;
  }
  outbytes = 0;
  used = 0;
  iVar11 = move_reading_point(a,pxVar20->offset);
  if ((iVar11 != 0) ||
     (iVar11 = rd_contents_init(a,pxVar20->encoding,(pxVar20->a_sum).alg,(pxVar20->e_sum).alg),
     iVar11 != 0)) goto LAB_00132906;
  d = (void *)0x0;
  iVar11 = rd_contents(a,&d,&outbytes,&used,pxVar20->length);
  sVar29 = outbytes;
  if (iVar11 != 0) goto LAB_00132906;
  if (outbytes != pxVar20->size) {
    iVar11 = -0x1e;
    pcVar28 = "Decompressed size error";
LAB_001328f7:
    archive_set_error(&a->archive,-1,pcVar28);
    goto LAB_00132906;
  }
  iVar11 = checksum_final(a,(pxVar20->a_sum).val,(pxVar20->a_sum).len,(pxVar20->e_sum).val,
                          (pxVar20->e_sum).len);
  if (iVar11 != 0) {
    pcVar28 = "Xattr checksum error";
LAB_001328f4:
    iVar11 = -0x14;
    goto LAB_001328f7;
  }
  pcVar28 = (pxVar20->name).s;
  if (pcVar28 == (char *)0x0) {
    pcVar28 = "Xattr name error";
    goto LAB_001328f4;
  }
  archive_entry_xattr_add_entry(local_178,pcVar28,d,sVar29);
  pxVar20 = pxVar20->next;
  iVar11 = 0;
  goto LAB_001327f9;
}

Assistant:

static int
xar_read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct xar *xar;
	struct xar_file *file;
	struct xattr *xattr;
	int r;

	xar = (struct xar *)(a->format->data);
	r = ARCHIVE_OK;

	if (xar->offset == 0) {
		/* Create a character conversion object. */
		if (xar->sconv == NULL) {
			xar->sconv = archive_string_conversion_from_charset(
			    &(a->archive), "UTF-8", 1);
			if (xar->sconv == NULL)
				return (ARCHIVE_FATAL);
		}

		/* Read TOC. */
		r = read_toc(a);
		if (r != ARCHIVE_OK)
			return (r);
	}

	for (;;) {
		file = xar->file = heap_get_entry(&(xar->file_queue));
		if (file == NULL) {
			xar->end_of_file = 1;
			return (ARCHIVE_EOF);
		}
		if ((file->mode & AE_IFMT) != AE_IFDIR)
			break;
		if (file->has != (HAS_PATHNAME | HAS_TYPE))
			break;
		/*
		 * If a file type is a directory and it does not have
		 * any metadata, do not export.
		 */
		file_free(file);
	}
        if (file->has & HAS_ATIME) {
          archive_entry_set_atime(entry, file->atime, 0);
        }
        if (file->has & HAS_CTIME) {
          archive_entry_set_ctime(entry, file->ctime, 0);
        }
        if (file->has & HAS_MTIME) {
          archive_entry_set_mtime(entry, file->mtime, 0);
        }
	archive_entry_set_gid(entry, file->gid);
	if (file->gname.length > 0 &&
	    archive_entry_copy_gname_l(entry, file->gname.s,
		archive_strlen(&(file->gname)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Gname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Gname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}
	archive_entry_set_uid(entry, file->uid);
	if (file->uname.length > 0 &&
	    archive_entry_copy_uname_l(entry, file->uname.s,
		archive_strlen(&(file->uname)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Uname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Uname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}
	archive_entry_set_mode(entry, file->mode);
	if (archive_entry_copy_pathname_l(entry, file->pathname.s,
	    archive_strlen(&(file->pathname)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}


	if (file->symlink.length > 0 &&
	    archive_entry_copy_symlink_l(entry, file->symlink.s,
		archive_strlen(&(file->symlink)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Linkname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}
	/* Set proper nlink. */
	if ((file->mode & AE_IFMT) == AE_IFDIR)
		archive_entry_set_nlink(entry, file->subdirs + 2);
	else
		archive_entry_set_nlink(entry, file->nlink);
	archive_entry_set_size(entry, file->size);
	if (archive_strlen(&(file->hardlink)) > 0)
		archive_entry_set_hardlink(entry, file->hardlink.s);
	archive_entry_set_ino64(entry, file->ino64);
	if (file->has & HAS_DEV)
		archive_entry_set_dev(entry, file->dev);
	if (file->has & HAS_DEVMAJOR)
		archive_entry_set_devmajor(entry, file->devmajor);
	if (file->has & HAS_DEVMINOR)
		archive_entry_set_devminor(entry, file->devminor);
	if (archive_strlen(&(file->fflags_text)) > 0)
		archive_entry_copy_fflags_text(entry, file->fflags_text.s);

	xar->entry_init = 1;
	xar->entry_total = 0;
	xar->entry_remaining = file->length;
	xar->entry_size = file->size;
	xar->entry_encoding = file->encoding;
	xar->entry_a_sum = file->a_sum;
	xar->entry_e_sum = file->e_sum;
	/*
	 * Read extended attributes.
	 */
	xattr = file->xattr_list;
	while (xattr != NULL) {
		const void *d;
		size_t outbytes = 0;
		size_t used = 0;

		r = move_reading_point(a, xattr->offset);
		if (r != ARCHIVE_OK)
			break;
		r = rd_contents_init(a, xattr->encoding,
		    xattr->a_sum.alg, xattr->e_sum.alg);
		if (r != ARCHIVE_OK)
			break;
		d = NULL;
		r = rd_contents(a, &d, &outbytes, &used, xattr->length);
		if (r != ARCHIVE_OK)
			break;
		if (outbytes != xattr->size) {
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Decompressed size error");
			r = ARCHIVE_FATAL;
			break;
		}
		r = checksum_final(a,
		    xattr->a_sum.val, xattr->a_sum.len,
		    xattr->e_sum.val, xattr->e_sum.len);
		if (r != ARCHIVE_OK) {
#ifndef DONT_FAIL_ON_CRC_ERROR
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Xattr checksum error");
			r = ARCHIVE_WARN;
			break;
#endif
		}
		if (xattr->name.s == NULL) {
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Xattr name error");
			r = ARCHIVE_WARN;
			break;
		}
		archive_entry_xattr_add_entry(entry,
		    xattr->name.s, d, outbytes);
		xattr = xattr->next;
	}
	if (r != ARCHIVE_OK) {
		file_free(file);
		return (r);
	}

	if (xar->entry_remaining > 0)
		/* Move reading point to the beginning of current
		 * file contents. */
		r = move_reading_point(a, file->offset);
	else
		r = ARCHIVE_OK;

	file_free(file);
	return (r);
}